

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall
helics::CoreBroker::processLocalCommandInstruction(CoreBroker *this,ActionMessage *message)

{
  GlobalFederateId sourceId;
  GlobalFederateId destId;
  string_view message_00;
  pointer pbVar1;
  _Alloc_hider __src;
  int iVar2;
  long lVar3;
  int *piVar4;
  size_type __rlen_1;
  size_t sVar5;
  char *extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  size_type __rlen;
  double dVar6;
  string_view V;
  string_view V_00;
  string_view fmt;
  string_view str;
  string_view newFederate;
  string_view name;
  format_args args;
  string_view sVar7;
  string warnString;
  ActionMessage barrier;
  pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_138;
  string local_118;
  size_t local_f8;
  byte *pbStack_f0;
  ActionMessage local_e8;
  
  BrokerBase::processBaseCommands(&local_138,&this->super_BrokerBase,message);
  pbVar1 = local_138.second.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_138.first != false) goto LAB_002f0b0f;
  sVar5 = (local_138.second.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_len;
  piVar4 = (int *)(local_138.second.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_str;
  if (sVar5 == 3) {
    iVar2 = bcmp(piVar4,"set",3);
    if ((((iVar2 == 0) &&
         (0x20 < (ulong)((long)local_138.second.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1))) &&
        (pbVar1[1]._M_len == 7)) &&
       (*(int *)((long)pbVar1[1]._M_str + 3) == 0x72656972 && *(int *)pbVar1[1]._M_str == 0x72726162
       )) {
      ActionMessage::ActionMessage(&local_e8,cmd_time_barrier);
      sVar7._M_str = extraout_RDX;
      sVar7._M_len = (size_t)local_138.second.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2]._M_str;
      dVar6 = gmlc::utilities::numeric_conversionComplete<double>
                        ((utilities *)
                         local_138.second.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2]._M_len,sVar7,0.0);
      local_e8.actionTime.internalTimeCode = 0x7fffffffffffffff;
      if (dVar6 <= -9223372036.854765) {
        local_e8.actionTime.internalTimeCode = -0x7fffffffffffffff;
      }
      else if (dVar6 < 9223372036.854765) {
        local_e8.actionTime.internalTimeCode =
             (baseType)
             (dVar6 * 1000000000.0 +
             *(double *)(&DAT_003c8030 + (ulong)(0.0 <= dVar6 * 1000000000.0) * 8));
      }
      if (0x30 < (ulong)((long)local_138.second.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.second.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        V_00._M_str = (char *)0x0;
        V_00._M_len = (size_t)local_138.second.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3]._M_str;
        iVar2 = gmlc::utilities::numeric_conversionComplete<int>
                          ((utilities *)
                           local_138.second.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[3]._M_len,V_00,
                           (int)((long)local_138.second.
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_138.second.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
        local_e8.messageID = iVar2;
      }
      generateTimeBarrier(this,&local_e8);
LAB_002f0cc0:
      ActionMessage::~ActionMessage(&local_e8);
      goto LAB_002f0b0f;
    }
  }
  else if (sVar5 == 5) {
    iVar2 = bcmp(piVar4,"clear",5);
    if (((iVar2 == 0) &&
        (0x10 < (ulong)((long)local_138.second.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1))) &&
       ((pbVar1[1]._M_len == 7 &&
        (*(int *)((long)pbVar1[1]._M_str + 3) == 0x72656972 &&
         *(int *)pbVar1[1]._M_str == 0x72726162)))) {
      ActionMessage::ActionMessage(&local_e8,cmd_time_barrier_clear);
      local_e8.flags._1_1_ = local_e8.flags._1_1_ | 0x20;
      if (0x20 < (ulong)((long)local_138.second.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.second.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        V._M_str = (char *)0x0;
        V._M_len = (size_t)local_138.second.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[2]._M_str;
        iVar2 = gmlc::utilities::numeric_conversionComplete<int>
                          ((utilities *)
                           local_138.second.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[2]._M_len,V,
                           (int)((long)local_138.second.
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_138.second.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
        local_e8.messageID = iVar2;
      }
      generateTimeBarrier(this,&local_e8);
      goto LAB_002f0cc0;
    }
  }
  else if ((sVar5 == 7) && (*(int *)((long)piVar4 + 3) == 0x726f7469 && *piVar4 == 0x696e6f6d)) {
    lVar3 = (long)local_138.second.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_138.second.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    if (lVar3 == 1) goto LAB_002f0b0f;
    if (lVar3 == 3) {
      dVar6 = gmlc::utilities::getTimeValue
                        (*(string_view *)
                          (local_138.second.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 2),sec);
LAB_002f0b71:
      lVar3 = 0x7fffffffffffffff;
      if (dVar6 <= -9223372036.854765) {
        lVar3 = -0x7fffffffffffffff;
      }
      else if (dVar6 < 9223372036.854765) {
        lVar3 = (long)(dVar6 * 1000000000.0 +
                      *(double *)(&DAT_003c8030 + (ulong)(0.0 <= dVar6 * 1000000000.0) * 8));
      }
      (this->mTimeMonitorPeriod).internalTimeCode = lVar3;
      sVar5 = local_138.second.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1]._M_len;
      piVar4 = (int *)local_138.second.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]._M_str;
    }
    else {
      if (lVar3 != 2) {
        sVar7 = gmlc::utilities::string_viewOps::merge
                          (*(string_view *)
                            (local_138.second.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 2),
                           *(string_view *)
                            (local_138.second.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 3));
        dVar6 = gmlc::utilities::getTimeValue(sVar7,sec);
        goto LAB_002f0b71;
      }
      sVar5 = local_138.second.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1]._M_len;
      piVar4 = (int *)local_138.second.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]._M_str;
      if (sVar5 == 3) {
        if (*(char *)((long)piVar4 + 2) == 'f' && (short)*piVar4 == 0x666f) goto LAB_002f0c69;
      }
      else if ((sVar5 == 4) && (*piVar4 == 0x706f7473)) {
LAB_002f0c69:
        loadTimeMonitor(this,false,(string_view)(ZEXT816(0x3ee654) << 0x40));
        goto LAB_002f0b0f;
      }
    }
    newFederate._M_str = (char *)piVar4;
    newFederate._M_len = sVar5;
    loadTimeMonitor(this,false,newFederate);
    goto LAB_002f0b0f;
  }
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x26;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_e8;
  local_e8._0_8_ = piVar4;
  local_e8._8_8_ = sVar5;
  ::fmt::v11::vformat_abi_cxx11_
            (&local_118,(v11 *)" unrecognized command instruction \"{}\"",fmt,args);
  local_f8 = local_118._M_string_length;
  pbStack_f0 = (byte *)local_118._M_dataplus._M_p;
  message_00._M_str = local_118._M_dataplus._M_p;
  message_00._M_len = local_118._M_string_length;
  name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
  name._M_len = (this->super_BrokerBase).identifier._M_string_length;
  BrokerBase::sendToLogger
            (&this->super_BrokerBase,
             (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name,message_00
             ,false);
  sourceId.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  destId.gid = (message->source_id).gid;
  if (destId.gid != sourceId.gid) {
    ActionMessage::ActionMessage(&local_e8,cmd_warning,sourceId,destId);
    __src._M_p = local_118._M_dataplus._M_p;
    if ((byte *)local_118._M_dataplus._M_p == local_e8.payload.heap) {
      local_e8.payload.bufferSize = local_118._M_string_length;
    }
    else {
      SmallBuffer::reserve(&local_e8.payload,local_118._M_string_length);
      local_e8.payload.bufferSize = local_118._M_string_length;
      if (local_118._M_string_length != 0) {
        memcpy(local_e8.payload.heap,__src._M_p,local_118._M_string_length);
      }
    }
    local_e8.messageID = 3;
    str._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    str._M_len = (this->super_BrokerBase).identifier._M_string_length;
    ActionMessage::setString(&local_e8,0,str);
    routeMessage(this,&local_e8);
    ActionMessage::~ActionMessage(&local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
LAB_002f0b0f:
  if (local_138.second.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.second.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.second.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.second.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CoreBroker::processLocalCommandInstruction(ActionMessage& message)
{
    auto [processed, res] = processBaseCommands(message);
    if (processed) {
        return;
    }

    if (res[0] == "monitor") {
        switch (res.size()) {
            case 1:
                break;
            case 2:
                if (res[1] == "stop" || res[1] == "off") {
                    loadTimeMonitor(false, "");
                } else {
                    loadTimeMonitor(false, res[1]);
                }
                break;
            case 3:
                mTimeMonitorPeriod = loadTimeFromString(res[2], time_units::sec);
                loadTimeMonitor(false, res[1]);
                break;
            case 4:
            default:
                mTimeMonitorPeriod =
                    loadTimeFromString(gmlc::utilities::string_viewOps::merge(res[2], res[3]),
                                       time_units::sec);
                loadTimeMonitor(false, res[1]);
                break;
        }
    } else if ((res[0] == "set") && (res.size() > 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER);
        barrier.actionTime = gmlc::utilities::numeric_conversionComplete<double>(res[2], 0.0);
        if (res.size() >= 4) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[3], 0);
        }

        generateTimeBarrier(barrier);
    } else if ((res[0] == "clear") && (res.size() >= 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER_CLEAR);
        setActionFlag(barrier, cancel_flag);
        if (res.size() >= 3) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[2], 0);
        }
        generateTimeBarrier(barrier);
    } else {
        auto warnString = fmt::format(" unrecognized command instruction \"{}\"", res[0]);
        LOG_WARNING(global_broker_id_local, getIdentifier(), warnString);
        if (message.source_id != global_broker_id_local) {
            ActionMessage warn(CMD_WARNING, global_broker_id_local, message.source_id);
            warn.payload = std::move(warnString);
            warn.messageID = HELICS_LOG_LEVEL_WARNING;
            warn.setString(0, getIdentifier());
            routeMessage(warn);
        }
    }
}